

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# marginal.cc
# Opt level: O0

base_learner * marginal_setup(options_i *options,vw *all)

{
  byte bVar1;
  typed_option<float> *this;
  pointer pdVar2;
  long lVar3;
  base_learner *f;
  learner<MARGINAL::data,_example> *this_00;
  vw *in_RSI;
  long *in_RDI;
  learner<MARGINAL::data,_example> *ret;
  size_t u;
  option_group_definition marginal_options;
  string marginal;
  free_ptr<MARGINAL::data> d;
  string *in_stack_fffffffffffff768;
  vw *in_stack_fffffffffffff770;
  string *in_stack_fffffffffffff778;
  typed_option<float> *in_stack_fffffffffffff780;
  vw *this_01;
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffff7b8;
  typed_option<float> *op;
  option_group_definition *in_stack_fffffffffffff7c0;
  ulong local_778;
  allocator local_769;
  string local_768 [39];
  allocator<char> local_741;
  string local_740 [39];
  allocator local_719;
  string local_718 [72];
  learner<char,_char> *in_stack_fffffffffffff930;
  allocator local_651;
  string local_650 [39];
  allocator local_629;
  string local_628 [199];
  allocator local_561;
  string local_560 [39];
  allocator local_539;
  string local_538 [199];
  allocator local_471;
  string local_470 [39];
  allocator local_449;
  string local_448 [199];
  allocator local_381;
  string local_380 [39];
  allocator local_359;
  string local_358 [199];
  allocator local_291;
  string local_290 [39];
  allocator local_269;
  string local_268 [199];
  allocator local_1a1;
  string local_1a0 [39];
  allocator local_179;
  string local_178 [32];
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_158;
  allocator local_a1;
  string local_a0 [32];
  undefined1 local_80 [56];
  string local_48 [48];
  vw *local_18;
  long *local_10;
  vw *local_8;
  
  local_18 = in_RSI;
  local_10 = in_RDI;
  scoped_calloc_or_throw<MARGINAL::data>();
  std::__cxx11::string::string(local_48);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_a0,"VW options",&local_a1);
  VW::config::option_group_definition::option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
  std::__cxx11::string::~string(local_a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_178,"marginal",&local_179);
  VW::config::make_option<std::__cxx11::string>
            (in_stack_fffffffffffff778,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff770);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  keep(&local_158,true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1a0,"substitute marginal label estimates for ids",&local_1a1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  help((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
  VW::config::option_group_definition::add<VW::config::typed_option<std::__cxx11::string>&>
            (in_stack_fffffffffffff7c0,in_stack_fffffffffffff7b8);
  std::__cxx11::string::~string(local_1a0);
  std::allocator<char>::~allocator((allocator<char> *)&local_1a1);
  VW::config::
  typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~typed_option((typed_option<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)in_stack_fffffffffffff770);
  std::__cxx11::string::~string(local_178);
  std::allocator<char>::~allocator((allocator<char> *)&local_179);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_268,"initial_denominator",&local_269);
  std::unique_ptr<MARGINAL::data,_void_(*)(void_*)>::operator->
            ((unique_ptr<MARGINAL::data,_void_(*)(void_*)> *)0x3c4d8d);
  VW::config::make_option<float>(in_stack_fffffffffffff778,(float *)in_stack_fffffffffffff770);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff780,(float)((ulong)in_stack_fffffffffffff778 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_290,"initial denominator",&local_291);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff7c0,(typed_option<float> *)in_stack_fffffffffffff7b8);
  std::__cxx11::string::~string(local_290);
  std::allocator<char>::~allocator((allocator<char> *)&local_291);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff770);
  std::__cxx11::string::~string(local_268);
  std::allocator<char>::~allocator((allocator<char> *)&local_269);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_358,"initial_numerator",&local_359);
  std::unique_ptr<MARGINAL::data,_void_(*)(void_*)>::operator->
            ((unique_ptr<MARGINAL::data,_void_(*)(void_*)> *)0x3c4eb4);
  VW::config::make_option<float>(in_stack_fffffffffffff778,(float *)in_stack_fffffffffffff770);
  VW::config::typed_option<float>::default_value
            (in_stack_fffffffffffff780,(float)((ulong)in_stack_fffffffffffff778 >> 0x20));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_380,"initial numerator",&local_381);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            (in_stack_fffffffffffff7c0,(typed_option<float> *)in_stack_fffffffffffff7b8);
  std::__cxx11::string::~string(local_380);
  std::allocator<char>::~allocator((allocator<char> *)&local_381);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff770);
  std::__cxx11::string::~string(local_358);
  std::allocator<char>::~allocator((allocator<char> *)&local_359);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_448,"compete",&local_449);
  std::unique_ptr<MARGINAL::data,_void_(*)(void_*)>::operator->
            ((unique_ptr<MARGINAL::data,_void_(*)(void_*)> *)0x3c4fd7);
  VW::config::make_option<bool>(in_stack_fffffffffffff778,(bool *)in_stack_fffffffffffff770);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_470,"enable competition with marginal features",&local_471);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff7c0,(typed_option<bool> *)in_stack_fffffffffffff7b8);
  std::__cxx11::string::~string(local_470);
  std::allocator<char>::~allocator((allocator<char> *)&local_471);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff770);
  std::__cxx11::string::~string(local_448);
  std::allocator<char>::~allocator((allocator<char> *)&local_449);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_538,"update_before_learn",&local_539);
  std::unique_ptr<MARGINAL::data,_void_(*)(void_*)>::operator->
            ((unique_ptr<MARGINAL::data,_void_(*)(void_*)> *)0x3c50e2);
  VW::config::make_option<bool>(in_stack_fffffffffffff778,(bool *)in_stack_fffffffffffff770);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_560,"update marginal values before learning",&local_561);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff7c0,(typed_option<bool> *)in_stack_fffffffffffff7b8);
  std::__cxx11::string::~string(local_560);
  std::allocator<char>::~allocator((allocator<char> *)&local_561);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff770);
  std::__cxx11::string::~string(local_538);
  std::allocator<char>::~allocator((allocator<char> *)&local_539);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_628,"unweighted_marginals",&local_629);
  std::unique_ptr<MARGINAL::data,_void_(*)(void_*)>::operator->
            ((unique_ptr<MARGINAL::data,_void_(*)(void_*)> *)0x3c51e4);
  VW::config::make_option<bool>(in_stack_fffffffffffff778,(bool *)in_stack_fffffffffffff770);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_650,"ignore importance weights when computing marginals",&local_651);
  VW::config::typed_option<bool>::help
            ((typed_option<bool> *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
  VW::config::option_group_definition::add<VW::config::typed_option<bool>&>
            (in_stack_fffffffffffff7c0,(typed_option<bool> *)in_stack_fffffffffffff7b8);
  std::__cxx11::string::~string(local_650);
  std::allocator<char>::~allocator((allocator<char> *)&local_651);
  VW::config::typed_option<bool>::~typed_option((typed_option<bool> *)in_stack_fffffffffffff770);
  std::__cxx11::string::~string(local_628);
  std::allocator<char>::~allocator((allocator<char> *)&local_629);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_718,"decay",&local_719);
  std::unique_ptr<MARGINAL::data,_void_(*)(void_*)>::operator->
            ((unique_ptr<MARGINAL::data,_void_(*)(void_*)> *)0x3c52da);
  VW::config::make_option<float>(in_stack_fffffffffffff778,(float *)in_stack_fffffffffffff770);
  this = VW::config::typed_option<float>::default_value
                   (in_stack_fffffffffffff780,(float)((ulong)in_stack_fffffffffffff778 >> 0x20));
  op = (typed_option<float> *)&local_741;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_740,"decay multiplier per event (1e-3 for example)",(allocator *)op);
  VW::config::typed_option<float>::help
            ((typed_option<float> *)in_stack_fffffffffffff770,in_stack_fffffffffffff768);
  VW::config::option_group_definition::add<VW::config::typed_option<float>&>
            ((option_group_definition *)this,op);
  std::__cxx11::string::~string(local_740);
  std::allocator<char>::~allocator(&local_741);
  VW::config::typed_option<float>::~typed_option((typed_option<float> *)in_stack_fffffffffffff770);
  std::__cxx11::string::~string(local_718);
  std::allocator<char>::~allocator((allocator<char> *)&local_719);
  (**(code **)*local_10)(local_10,local_80);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_768,"marginal",&local_769);
  bVar1 = (**(code **)(*local_10 + 8))(local_10,local_768);
  std::__cxx11::string::~string(local_768);
  std::allocator<char>::~allocator((allocator<char> *)&local_769);
  if (((bVar1 ^ 0xff) & 1) == 0) {
    pdVar2 = std::unique_ptr<MARGINAL::data,_void_(*)(void_*)>::operator->
                       ((unique_ptr<MARGINAL::data,_void_(*)(void_*)> *)0x3c59d4);
    pdVar2->all = local_18;
    this_01 = local_18;
    for (local_778 = 0; local_778 < 0x100; local_778 = local_778 + 1) {
      lVar3 = std::__cxx11::string::find((char)local_48,(ulong)(uint)(int)(char)local_778);
      if (lVar3 != -1) {
        pdVar2 = std::unique_ptr<MARGINAL::data,_void_(*)(void_*)>::operator->
                           ((unique_ptr<MARGINAL::data,_void_(*)(void_*)> *)0x3c5a29);
        pdVar2->id_features[local_778] = true;
      }
    }
    f = setup_base((options_i *)in_stack_fffffffffffff778,in_stack_fffffffffffff770);
    in_stack_fffffffffffff780 =
         (typed_option<float> *)LEARNER::as_singleline<char,char>(in_stack_fffffffffffff930);
    this_00 = LEARNER::init_learner<MARGINAL::data,example,LEARNER::learner<char,example>>
                        ((free_ptr<MARGINAL::data> *)in_stack_fffffffffffff780,
                         (learner<char,_example> *)in_stack_fffffffffffff778,
                         (_func_void_data_ptr_learner<char,_example>_ptr_example_ptr *)
                         in_stack_fffffffffffff770,
                         (_func_void_data_ptr_learner<char,_example>_ptr_example_ptr *)
                         in_stack_fffffffffffff768);
    LEARNER::learner<MARGINAL::data,_example>::set_finish
              ((learner<MARGINAL::data,_example> *)this_01,(_func_void_data_ptr *)f);
    LEARNER::learner<MARGINAL::data,_example>::set_save_load(this_00,MARGINAL::save_load);
    in_stack_fffffffffffff770 = (vw *)LEARNER::make_base<MARGINAL::data,example>(this_00);
    local_8 = in_stack_fffffffffffff770;
  }
  else {
    local_8 = (vw *)0x0;
  }
  VW::config::option_group_definition::~option_group_definition
            ((option_group_definition *)in_stack_fffffffffffff770);
  std::__cxx11::string::~string(local_48);
  std::unique_ptr<MARGINAL::data,_void_(*)(void_*)>::~unique_ptr
            ((unique_ptr<MARGINAL::data,_void_(*)(void_*)> *)in_stack_fffffffffffff780);
  return (base_learner *)local_8;
}

Assistant:

LEARNER::base_learner* marginal_setup(options_i& options, vw& all)
{
  free_ptr<MARGINAL::data> d = scoped_calloc_or_throw<MARGINAL::data>();
  std::string marginal;

  option_group_definition marginal_options("VW options");
  marginal_options.add(make_option("marginal", marginal).keep().help("substitute marginal label estimates for ids"));
  marginal_options.add(
      make_option("initial_denominator", d->initial_denominator).default_value(1.f).help("initial denominator"));
  marginal_options.add(
      make_option("initial_numerator", d->initial_numerator).default_value(0.5f).help("initial numerator"));
  marginal_options.add(make_option("compete", d->compete).help("enable competition with marginal features"));
  marginal_options.add(
      make_option("update_before_learn", d->update_before_learn).help("update marginal values before learning"));
  marginal_options.add(make_option("unweighted_marginals", d->unweighted_marginals)
                           .help("ignore importance weights when computing marginals"));
  marginal_options.add(
      make_option("decay", d->decay).default_value(0.f).help("decay multiplier per event (1e-3 for example)"));
  options.add_and_parse(marginal_options);

  if (!options.was_supplied("marginal"))
  {
    return nullptr;
  }

  d->all = &all;

  for (size_t u = 0; u < 256; u++)
    if (marginal.find((char)u) != string::npos)
      d->id_features[u] = true;

  LEARNER::learner<MARGINAL::data, example>& ret =
      init_learner(d, as_singleline(setup_base(options, all)), predict_or_learn<true>, predict_or_learn<false>);
  ret.set_finish(finish);
  ret.set_save_load(save_load);

  return make_base(ret);
}